

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseArray(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *end;
  SynBase *node;
  IntrusiveList<SynBase> IVar3;
  SynBase *local_60;
  SynBase *value;
  IntrusiveList<SynBase> values;
  uint blockLimit;
  IntrusiveList<SynBase> expressions;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_ofigure);
  if (bVar1) {
    bVar1 = ParseContext::At(ctx,lex_for);
    if (bVar1) {
      IVar3 = ParseExpressions(ctx);
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      ctx_local = (ParseContext *)ParseContext::get<SynGenerator>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynGenerator::SynGenerator((SynGenerator *)ctx_local,begin,pLVar2,IVar3);
    }
    else {
      values.tail._4_4_ = 0x100;
      if (0xff < ctx->expressionBlockDepth) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Stop(ctx,pLVar2,"ERROR: reached nested array limit of %d",0x100);
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth + 1;
      IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&value);
      local_60 = ParseTernaryExpr(ctx);
      if (local_60 == (SynBase *)0x0) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: value not found after \'{\'");
        local_60 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Current(ctx);
        end = ParseContext::Current(ctx);
        SynError::SynError((SynError *)local_60,pLVar2,end);
      }
      IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&value,local_60);
      while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
        node = ParseTernaryExpr(ctx);
        if (node == (SynBase *)0x0) {
          pLVar2 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: value not found after \',\'");
        }
        else {
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&value,node);
        }
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth - 1;
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      ctx_local = (ParseContext *)ParseContext::get<SynArray>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      IVar3.tail = values.head;
      IVar3.head = value;
      SynArray::SynArray((SynArray *)ctx_local,begin,pLVar2,IVar3);
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseArray(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		if(ctx.At(lex_for))
		{
			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

			return new (ctx.get<SynGenerator>()) SynGenerator(start, ctx.Previous(), expressions);
		}

		const unsigned blockLimit = 256;

		if(ctx.expressionBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested array limit of %d", blockLimit);

		ctx.expressionBlockDepth++;

		IntrusiveList<SynBase> values;

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: value not found after '{'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		values.push_back(value);

		while(ctx.Consume(lex_comma))
		{
			value = ParseTernaryExpr(ctx);

			if(!value)
				Report(ctx, ctx.Current(), "ERROR: value not found after ','");
			else
				values.push_back(value);
		}

		ctx.expressionBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

		return new (ctx.get<SynArray>()) SynArray(start, ctx.Previous(), values);
	}

	return NULL;
}